

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O1

int __thiscall ncnn::Embed::load_param(Embed *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->num_output = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->input_dim = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->bias_term = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->weight_data_size = iVar1;
  iVar1 = ParamDict::get(pd,0x12,0);
  this->int8_scale_term = iVar1;
  return 0;
}

Assistant:

int Embed::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    input_dim = pd.get(1, 0);
    bias_term = pd.get(2, 0);
    weight_data_size = pd.get(3, 0);
    int8_scale_term = pd.get(18, 0);

    return 0;
}